

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall polyscope::render::Engine::allocateGlobalBuffersAndPrograms(Engine *this)

{
  long *plVar1;
  element_type *peVar2;
  element_type *peVar3;
  Engine *this_00;
  element_type *peVar4;
  long *in_RDI;
  shared_ptr<polyscope::render::RenderBuffer> sceneDepthAlt;
  shared_ptr<polyscope::render::RenderBuffer> sceneColorAlt;
  shared_ptr<polyscope::render::FrameBuffer> *in_stack_fffffffffffff7a8;
  shared_ptr<polyscope::render::FrameBuffer> *in_stack_fffffffffffff7b0;
  allocator *paVar5;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *in_stack_fffffffffffff7c0;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *this_01;
  Engine *in_stack_fffffffffffff7d8;
  undefined1 *puVar6;
  Engine *in_stack_fffffffffffff848;
  Engine *this_02;
  Engine *this_03;
  allocator local_549;
  string local_548 [32];
  undefined1 local_528 [31];
  allocator local_509;
  string local_508 [32];
  undefined1 local_4e8 [16];
  undefined8 local_4d8;
  allocator local_4c1;
  string local_4c0 [32];
  undefined1 local_4a0 [23];
  allocator local_489;
  string local_488 [32];
  undefined1 local_468 [31];
  allocator local_449;
  string local_448 [32];
  undefined1 local_428 [16];
  undefined8 local_418;
  allocator local_409;
  string local_408 [32];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [31];
  allocator local_3b9;
  string local_3b8 [32];
  undefined1 local_398 [16];
  undefined8 local_388;
  allocator local_379;
  string local_378 [32];
  undefined1 local_358 [16];
  undefined1 local_348 [31];
  allocator local_329;
  string local_328 [32];
  undefined1 local_308 [16];
  undefined8 local_2f8;
  allocator local_2e9;
  string local_2e8 [32];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [31];
  allocator local_299;
  string local_298 [32];
  undefined1 local_278 [16];
  undefined8 local_268;
  allocator local_259;
  string local_258 [32];
  undefined1 local_238 [16];
  undefined1 local_228 [31];
  allocator local_209;
  string local_208 [32];
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  allocator local_1c9;
  string local_1c8 [32];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [76];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [20];
  vec<3,float,(glm::qualifier)0> local_e4 [8];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [20];
  vec<3,float,(glm::qualifier)0> local_74 [8];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_6c;
  undefined1 local_68 [32];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  undefined1 local_18 [24];
  
  (**(code **)(*in_RDI + 0xf8))(local_18,in_RDI,4,view::bufferWidth,view::bufferHeight);
  std::shared_ptr<polyscope::render::TextureBuffer>::operator=
            ((shared_ptr<polyscope::render::TextureBuffer> *)in_stack_fffffffffffff7b0,
             (shared_ptr<polyscope::render::TextureBuffer> *)in_stack_fffffffffffff7a8);
  std::shared_ptr<polyscope::render::TextureBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::TextureBuffer> *)0x369941);
  (**(code **)(*in_RDI + 0xf8))(local_28,in_RDI,9,view::bufferWidth,view::bufferHeight,0);
  std::shared_ptr<polyscope::render::TextureBuffer>::operator=
            ((shared_ptr<polyscope::render::TextureBuffer> *)in_stack_fffffffffffff7b0,
             (shared_ptr<polyscope::render::TextureBuffer> *)in_stack_fffffffffffff7a8);
  std::shared_ptr<polyscope::render::TextureBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::TextureBuffer> *)0x3699b0);
  (**(code **)(*in_RDI + 0x110))(local_38,in_RDI,view::bufferWidth,view::bufferHeight);
  std::shared_ptr<polyscope::render::FrameBuffer>::operator=
            (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
  std::shared_ptr<polyscope::render::FrameBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::FrameBuffer> *)0x369a19);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x369a26);
  std::shared_ptr<polyscope::render::TextureBuffer>::shared_ptr
            ((shared_ptr<polyscope::render::TextureBuffer> *)in_stack_fffffffffffff7b0,
             (shared_ptr<polyscope::render::TextureBuffer> *)in_stack_fffffffffffff7a8);
  (*peVar2->_vptr_FrameBuffer[6])(peVar2,local_48);
  std::shared_ptr<polyscope::render::TextureBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::TextureBuffer> *)0x369a73);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x369a87);
  std::shared_ptr<polyscope::render::TextureBuffer>::shared_ptr
            ((shared_ptr<polyscope::render::TextureBuffer> *)in_stack_fffffffffffff7b0,
             (shared_ptr<polyscope::render::TextureBuffer> *)in_stack_fffffffffffff7a8);
  (*peVar2->_vptr_FrameBuffer[8])(peVar2,local_68);
  std::shared_ptr<polyscope::render::TextureBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::TextureBuffer> *)0x369adb);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x369af7);
  (*peVar2->_vptr_FrameBuffer[9])();
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>(local_74,1.0,1.0,1.0);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x369b2d);
  (peVar2->clearColor).field_2 = local_6c;
  *(vec<3,float,(glm::qualifier)0> (*) [8])&peVar2->clearColor = local_74;
  peVar2 = std::
           __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x369b50);
  peVar2->clearAlpha = 0.0;
  (**(code **)(*in_RDI + 0xf8))(local_88,in_RDI,9,view::bufferWidth,view::bufferHeight,0);
  std::shared_ptr<polyscope::render::TextureBuffer>::operator=
            ((shared_ptr<polyscope::render::TextureBuffer> *)in_stack_fffffffffffff7b0,
             (shared_ptr<polyscope::render::TextureBuffer> *)in_stack_fffffffffffff7a8);
  std::shared_ptr<polyscope::render::TextureBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::TextureBuffer> *)0x369bd9);
  (**(code **)(*in_RDI + 0x110))(local_98,in_RDI,view::bufferWidth,view::bufferHeight);
  std::shared_ptr<polyscope::render::FrameBuffer>::operator=
            (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
  std::shared_ptr<polyscope::render::FrameBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::FrameBuffer> *)0x369c42);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x369c4f);
  std::shared_ptr<polyscope::render::TextureBuffer>::shared_ptr
            ((shared_ptr<polyscope::render::TextureBuffer> *)in_stack_fffffffffffff7b0,
             (shared_ptr<polyscope::render::TextureBuffer> *)in_stack_fffffffffffff7a8);
  (*peVar2->_vptr_FrameBuffer[8])(peVar2,local_a8);
  std::shared_ptr<polyscope::render::TextureBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::TextureBuffer> *)0x369c9c);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x369cb0);
  peVar2->clearDepth = 0.0;
  (**(code **)(*in_RDI + 0xf8))(local_b8,in_RDI,4,view::bufferWidth,view::bufferHeight,0);
  std::shared_ptr<polyscope::render::TextureBuffer>::operator=
            ((shared_ptr<polyscope::render::TextureBuffer> *)in_stack_fffffffffffff7b0,
             (shared_ptr<polyscope::render::TextureBuffer> *)in_stack_fffffffffffff7a8);
  std::shared_ptr<polyscope::render::TextureBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::TextureBuffer> *)0x369d39);
  (**(code **)(*in_RDI + 0x110))(local_c8,in_RDI,view::bufferWidth,view::bufferHeight);
  std::shared_ptr<polyscope::render::FrameBuffer>::operator=
            (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
  std::shared_ptr<polyscope::render::FrameBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::FrameBuffer> *)0x369da2);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x369daf);
  std::shared_ptr<polyscope::render::TextureBuffer>::shared_ptr
            ((shared_ptr<polyscope::render::TextureBuffer> *)in_stack_fffffffffffff7b0,
             (shared_ptr<polyscope::render::TextureBuffer> *)in_stack_fffffffffffff7a8);
  (*peVar2->_vptr_FrameBuffer[6])(peVar2,local_d8);
  std::shared_ptr<polyscope::render::TextureBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::TextureBuffer> *)0x369dfc);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x369e18);
  (*peVar2->_vptr_FrameBuffer[9])();
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>(local_e4,1.0,1.0,1.0);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x369e4e);
  (peVar2->clearColor).field_2 = local_dc;
  *(vec<3,float,(glm::qualifier)0> (*) [8])&peVar2->clearColor = local_e4;
  peVar2 = std::
           __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x369e71);
  peVar2->clearAlpha = 0.0;
  (**(code **)(*in_RDI + 0x108))(local_f8,in_RDI,1,view::bufferWidth,view::bufferHeight);
  (**(code **)(*in_RDI + 0x108))(local_108,in_RDI,2,view::bufferWidth,view::bufferHeight);
  (**(code **)(*in_RDI + 0x110))(local_118,in_RDI,view::bufferWidth,view::bufferHeight);
  std::shared_ptr<polyscope::render::FrameBuffer>::operator=
            (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
  std::shared_ptr<polyscope::render::FrameBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::FrameBuffer> *)0x369f5d);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x369f6a);
  std::shared_ptr<polyscope::render::RenderBuffer>::shared_ptr
            ((shared_ptr<polyscope::render::RenderBuffer> *)in_stack_fffffffffffff7b0,
             (shared_ptr<polyscope::render::RenderBuffer> *)in_stack_fffffffffffff7a8);
  (*peVar2->_vptr_FrameBuffer[5])(peVar2,local_128);
  std::shared_ptr<polyscope::render::RenderBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::RenderBuffer> *)0x369fb7);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x369fcb);
  std::shared_ptr<polyscope::render::RenderBuffer>::shared_ptr
            ((shared_ptr<polyscope::render::RenderBuffer> *)in_stack_fffffffffffff7b0,
             (shared_ptr<polyscope::render::RenderBuffer> *)in_stack_fffffffffffff7a8);
  (*peVar2->_vptr_FrameBuffer[7])(peVar2,local_138);
  std::shared_ptr<polyscope::render::RenderBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::RenderBuffer> *)0x36a018);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x36a02c);
  (*peVar2->_vptr_FrameBuffer[9])();
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)(local_188 + 0x44),1.0,1.0,1.0);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x36a075);
  (peVar2->clearColor).field_2 = local_13c;
  (peVar2->clearColor).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_188._68_4_;
  (peVar2->clearColor).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_188._72_4_;
  peVar2 = std::
           __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x36a098);
  peVar2->clearAlpha = 0.0;
  std::shared_ptr<polyscope::render::RenderBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::RenderBuffer> *)0x36a0ac);
  std::shared_ptr<polyscope::render::RenderBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::RenderBuffer> *)0x36a0b9);
  this_02 = (Engine *)&view::bufferWidth;
  (**(code **)(*in_RDI + 0x108))(local_188 + 0x30,in_RDI,3,view::bufferWidth,view::bufferHeight);
  std::shared_ptr<polyscope::render::RenderBuffer>::operator=
            ((shared_ptr<polyscope::render::RenderBuffer> *)in_stack_fffffffffffff7b0,
             (shared_ptr<polyscope::render::RenderBuffer> *)in_stack_fffffffffffff7a8);
  std::shared_ptr<polyscope::render::RenderBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::RenderBuffer> *)0x36a136);
  (**(code **)(*in_RDI + 0x108))
            (local_188 + 0x20,in_RDI,2,*(undefined4 *)&this_02->_vptr_Engine,view::bufferHeight);
  std::shared_ptr<polyscope::render::RenderBuffer>::operator=
            ((shared_ptr<polyscope::render::RenderBuffer> *)in_stack_fffffffffffff7b0,
             (shared_ptr<polyscope::render::RenderBuffer> *)in_stack_fffffffffffff7a8);
  std::shared_ptr<polyscope::render::RenderBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::RenderBuffer> *)0x36a19d);
  (**(code **)(*in_RDI + 0x110))
            (local_188 + 0x10,in_RDI,*(undefined4 *)&this_02->_vptr_Engine,view::bufferHeight);
  std::shared_ptr<polyscope::render::FrameBuffer>::operator=
            (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
  std::shared_ptr<polyscope::render::FrameBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::FrameBuffer> *)0x36a206);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x36a213);
  this_03 = (Engine *)local_188;
  std::shared_ptr<polyscope::render::RenderBuffer>::shared_ptr
            ((shared_ptr<polyscope::render::RenderBuffer> *)in_stack_fffffffffffff7b0,
             (shared_ptr<polyscope::render::RenderBuffer> *)in_stack_fffffffffffff7a8);
  (*peVar2->_vptr_FrameBuffer[5])(peVar2,this_03);
  std::shared_ptr<polyscope::render::RenderBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::RenderBuffer> *)0x36a260);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x36a274);
  std::shared_ptr<polyscope::render::RenderBuffer>::shared_ptr
            ((shared_ptr<polyscope::render::RenderBuffer> *)in_stack_fffffffffffff7b0,
             (shared_ptr<polyscope::render::RenderBuffer> *)in_stack_fffffffffffff7a8);
  (*peVar2->_vptr_FrameBuffer[7])(peVar2,local_198);
  std::shared_ptr<polyscope::render::RenderBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::RenderBuffer> *)0x36a2c8);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x36a2dc);
  (*peVar2->_vptr_FrameBuffer[9])();
  (**(code **)(*in_RDI + 0x88))(in_RDI,1);
  plVar1 = engine;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,"TEXTURE_DRAW_PLAIN",&local_1c9);
  local_1e8 = (undefined1  [16])0x0;
  local_1d8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x36a374);
  (**(code **)(*plVar1 + 0x118))(local_1a8,plVar1,local_1c8,local_1e8,2);
  std::shared_ptr<polyscope::render::ShaderProgram>::operator=
            ((shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffff7b0,
             (shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffff7a8);
  std::shared_ptr<polyscope::render::ShaderProgram>::~shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x36a3e1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff7c0);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  peVar3 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x36a415);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"a_position",&local_209);
  screenTrianglesCoords(in_stack_fffffffffffff848);
  (*peVar3->_vptr_ShaderProgram[0x10])(peVar3,local_208,local_228,0,0,0xffffffff);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector(in_stack_fffffffffffff7c0);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  plVar1 = engine;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"TEXTURE_DRAW_DOT3",&local_259);
  local_278 = (undefined1  [16])0x0;
  local_268 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x36a533);
  (**(code **)(*plVar1 + 0x118))(local_238,plVar1,local_258,local_278,2);
  std::shared_ptr<polyscope::render::ShaderProgram>::operator=
            ((shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffff7b0,
             (shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffff7a8);
  std::shared_ptr<polyscope::render::ShaderProgram>::~shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x36a5a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff7c0);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  peVar3 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x36a5d4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"a_position",&local_299);
  screenTrianglesCoords(in_stack_fffffffffffff848);
  (*peVar3->_vptr_ShaderProgram[0x10])(peVar3,local_298,local_2b8,0,0,0xffffffff);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector(in_stack_fffffffffffff7c0);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  plVar1 = engine;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"TEXTURE_DRAW_MAP3",&local_2e9);
  local_308 = (undefined1  [16])0x0;
  local_2f8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x36a6f2);
  (**(code **)(*plVar1 + 0x118))(local_2c8,plVar1,local_2e8,local_308,2);
  std::shared_ptr<polyscope::render::ShaderProgram>::operator=
            ((shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffff7b0,
             (shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffff7a8);
  std::shared_ptr<polyscope::render::ShaderProgram>::~shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x36a75f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff7c0);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  peVar3 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x36a793);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_328,"a_position",&local_329);
  screenTrianglesCoords(in_stack_fffffffffffff848);
  (*peVar3->_vptr_ShaderProgram[0x10])(peVar3,local_328,local_348,0,0,0xffffffff);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector(in_stack_fffffffffffff7c0);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  plVar1 = engine;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_378,"TEXTURE_DRAW_SPHEREBG",&local_379);
  local_398 = (undefined1  [16])0x0;
  local_388 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x36a8b1);
  (**(code **)(*plVar1 + 0x118))(local_358,plVar1,local_378,local_398,2);
  std::shared_ptr<polyscope::render::ShaderProgram>::operator=
            ((shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffff7b0,
             (shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffff7a8);
  std::shared_ptr<polyscope::render::ShaderProgram>::~shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x36a91e);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff7c0);
  std::__cxx11::string::~string(local_378);
  std::allocator<char>::~allocator((allocator<char> *)&local_379);
  this_00 = (Engine *)
            std::
            __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x36a952);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"a_position",&local_3b9);
  distantCubeCoords(in_stack_fffffffffffff7d8);
  (*this_00->_vptr_Engine[0x11])(this_00,local_3b8,local_3d8,0,0,0xffffffff);
  std::
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
             *)in_stack_fffffffffffff7c0);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  plVar1 = engine;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_408,"COMPOSITE_PEEL",&local_409);
  local_428 = (undefined1  [16])0x0;
  local_418 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x36aa6d);
  (**(code **)(*plVar1 + 0x118))(local_3e8,plVar1,local_408,local_428,2);
  std::shared_ptr<polyscope::render::ShaderProgram>::operator=
            ((shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffff7b0,
             (shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffff7a8);
  std::shared_ptr<polyscope::render::ShaderProgram>::~shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x36aace);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff7c0);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  peVar3 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x36aaff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_448,"a_position",&local_449);
  screenTrianglesCoords(this_00);
  (*peVar3->_vptr_ShaderProgram[0x10])(peVar3,local_448,local_468,0,0,0xffffffff);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector(in_stack_fffffffffffff7c0);
  std::__cxx11::string::~string(local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  peVar3 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x36abb2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_488,"t_image",&local_489);
  peVar4 = std::__shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2> *)
                      (in_RDI + 0x22));
  (*peVar3->_vptr_ShaderProgram[0x1a])(peVar3,local_488,peVar4);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator((allocator<char> *)&local_489);
  plVar1 = engine;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4c0,"DEPTH_COPY",&local_4c1);
  local_4e8 = (undefined1  [16])0x0;
  local_4d8 = 0;
  puVar6 = local_4e8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x36ac97);
  (**(code **)(*plVar1 + 0x118))(local_4a0,plVar1,local_4c0,puVar6,2);
  this_01 = (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             *)(in_RDI + 0x3a);
  std::shared_ptr<polyscope::render::ShaderProgram>::operator=
            ((shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffff7b0,
             (shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffff7a8);
  std::shared_ptr<polyscope::render::ShaderProgram>::~shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x36acf5);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_01);
  std::__cxx11::string::~string(local_4c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
  peVar3 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x36ad26);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_508,"a_position",&local_509);
  screenTrianglesCoords(this_00);
  (*peVar3->_vptr_ShaderProgram[0x10])(peVar3,local_508,local_528,0,0,0xffffffff);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector(this_01);
  std::__cxx11::string::~string(local_508);
  std::allocator<char>::~allocator((allocator<char> *)&local_509);
  peVar3 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x36add9);
  paVar5 = &local_549;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_548,"t_depth",paVar5);
  peVar4 = std::__shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2> *)
                      (in_RDI + 0x26));
  (*peVar3->_vptr_ShaderProgram[0x1a])(peVar3,local_548,peVar4);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  loadDefaultMaterials(this_02);
  loadDefaultColorMaps(this_03);
  return;
}

Assistant:

void Engine::allocateGlobalBuffersAndPrograms() {

  // Note: The display frame buffer should be manually wrapped by child classes

  { // Scene buffer

    // Note that this is basically duplicated in ground_plane.cpp, changes here should probably be reflected there
    sceneColor = generateTextureBuffer(TextureFormat::RGBA16F, view::bufferWidth, view::bufferHeight);
    // sceneDepth = generateRenderBuffer(RenderBufferType::Depth, view::bufferWidth, view::bufferHeight);
    sceneDepth = generateTextureBuffer(TextureFormat::DEPTH24, view::bufferWidth, view::bufferHeight);

    sceneBuffer = generateFrameBuffer(view::bufferWidth, view::bufferHeight);
    sceneBuffer->addColorBuffer(sceneColor);
    sceneBuffer->addDepthBuffer(sceneDepth);
    sceneBuffer->setDrawBuffers();

    sceneBuffer->clearColor = glm::vec3{1., 1., 1.};
    sceneBuffer->clearAlpha = 0.0;
  }

  { // Alternate depth texture used for some effects
    sceneDepthMin = generateTextureBuffer(TextureFormat::DEPTH24, view::bufferWidth, view::bufferHeight);

    sceneDepthMinFrame = generateFrameBuffer(view::bufferWidth, view::bufferHeight);
    sceneDepthMinFrame->addDepthBuffer(sceneDepthMin);
    sceneDepthMinFrame->clearDepth = 0.0;
  }

  { // "Final" scene buffer (after resolving)
    sceneColorFinal = generateTextureBuffer(TextureFormat::RGBA16F, view::bufferWidth, view::bufferHeight);

    sceneBufferFinal = generateFrameBuffer(view::bufferWidth, view::bufferHeight);
    sceneBufferFinal->addColorBuffer(sceneColorFinal);
    sceneBufferFinal->setDrawBuffers();

    sceneBufferFinal->clearColor = glm::vec3{1., 1., 1.};
    sceneBufferFinal->clearAlpha = 0.0;
  }

  { // Alternate display buffer
    std::shared_ptr<RenderBuffer> sceneColorAlt =
        generateRenderBuffer(RenderBufferType::ColorAlpha, view::bufferWidth, view::bufferHeight);
    std::shared_ptr<RenderBuffer> sceneDepthAlt =
        generateRenderBuffer(RenderBufferType::Depth, view::bufferWidth, view::bufferHeight);

    displayBufferAlt = generateFrameBuffer(view::bufferWidth, view::bufferHeight);
    displayBufferAlt->addColorBuffer(sceneColorAlt);
    displayBufferAlt->addDepthBuffer(sceneDepthAlt);
    displayBufferAlt->setDrawBuffers();

    displayBufferAlt->clearColor = glm::vec3{1., 1., 1.};
    displayBufferAlt->clearAlpha = 0.0;
  }

  { // Pick buffer
    pickColorBuffer = generateRenderBuffer(RenderBufferType::Float4, view::bufferWidth, view::bufferHeight);
    pickDepthBuffer = generateRenderBuffer(RenderBufferType::Depth, view::bufferWidth, view::bufferHeight);

    pickFramebuffer = generateFrameBuffer(view::bufferWidth, view::bufferHeight);
    pickFramebuffer->addColorBuffer(pickColorBuffer);
    pickFramebuffer->addDepthBuffer(pickDepthBuffer);
    pickFramebuffer->setDrawBuffers();
  }

  // Make sure all the buffer sizes are up to date
  updateWindowSize(true);

  { // Generate the general-use programs
    // clang-format off
    renderTexturePlain = render::engine->requestShader("TEXTURE_DRAW_PLAIN", {}, render::ShaderReplacementDefaults::Process);
    renderTexturePlain->setAttribute("a_position", screenTrianglesCoords());

    renderTextureDot3 = render::engine->requestShader("TEXTURE_DRAW_DOT3", {}, render::ShaderReplacementDefaults::Process);
    renderTextureDot3->setAttribute("a_position", screenTrianglesCoords());

    renderTextureMap3 = render::engine->requestShader("TEXTURE_DRAW_MAP3", {}, render::ShaderReplacementDefaults::Process);
    renderTextureMap3->setAttribute("a_position", screenTrianglesCoords());

    renderTextureSphereBG = render::engine->requestShader("TEXTURE_DRAW_SPHEREBG", {}, render::ShaderReplacementDefaults::Process);
    renderTextureSphereBG->setAttribute("a_position", distantCubeCoords());

    compositePeel = render::engine->requestShader("COMPOSITE_PEEL", {}, render::ShaderReplacementDefaults::Process);
    compositePeel->setAttribute("a_position", screenTrianglesCoords());
    compositePeel->setTextureFromBuffer("t_image", sceneColor.get());

    copyDepth = render::engine->requestShader("DEPTH_COPY", {}, render::ShaderReplacementDefaults::Process);
    copyDepth->setAttribute("a_position", screenTrianglesCoords());
    copyDepth->setTextureFromBuffer("t_depth", sceneDepth.get());
    // clang-format on
  }

  { // Load defaults
    loadDefaultMaterials();
    loadDefaultColorMaps();
  }
}